

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O1

char * mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::GetTypeName(void)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80 [2];
  long local_70 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>::GetTypeName()::name_abi_cxx11_ ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>::
                                 GetTypeName()::name_abi_cxx11_);
    if (iVar1 != 0) {
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"AlgebraicConstraint< ","")
      ;
      plVar2 = (long *)std::__cxx11::string::append((char *)local_80);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_90 = *plVar3;
        lStack_88 = plVar2[3];
        local_a0 = &local_90;
      }
      else {
        local_90 = *plVar3;
        local_a0 = (long *)*plVar2;
      }
      local_98 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_a0);
      psVar4 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_c0.field_2._M_allocated_capacity = *psVar4;
        local_c0.field_2._8_8_ = plVar2[3];
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar4;
        local_c0._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_c0._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      AlgConRhs<1>::GetTypeName_abi_cxx11_();
      std::operator+(&local_40,&local_c0,&local_60);
      std::operator+(&AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>::GetTypeName()::
                      name_abi_cxx11_,&local_40," >");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (local_a0 != &local_90) {
        operator_delete(local_a0,local_90 + 1);
      }
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      __cxa_atexit(std::__cxx11::string::~string,
                   &AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>::GetTypeName()::
                    name_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>::GetTypeName()
                           ::name_abi_cxx11_);
    }
  }
  return AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>::GetTypeName()::name_abi_cxx11_.
         _M_dataplus._M_p;
}

Assistant:

static const char* GetTypeName() {
    static std::string name {
      std::string("AlgebraicConstraint< ") +
      Body::GetTypeName() + ", " +
      RhsOrRange::GetTypeName() + " >" };
    return name.c_str();
  }